

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapic.cc
# Opt level: O1

bool __thiscall rapic::client::process_traffic(client *this)

{
  uint uVar1;
  bool bVar2;
  __fd_mask _Var3;
  int iVar4;
  int iVar5;
  uint *puVar6;
  time_t tVar7;
  ssize_t sVar8;
  size_t sVar9;
  system_error *psVar10;
  error_category *peVar11;
  runtime_error *this_00;
  ulong uVar12;
  ulong uVar13;
  code *pcVar14;
  undefined *puVar15;
  ulong uVar16;
  bool bVar17;
  error_code __ec;
  error_code __ec_00;
  error_code __ec_01;
  error_code __ec_02;
  error_code __ec_03;
  socklen_t len;
  int res;
  timeval local_c8;
  fd_set local_b8;
  
  if (this->state_ != disconnected) {
    if (this->state_ != in_progress) {
LAB_00107cc4:
      tVar7 = time((time_t *)0x0);
      if (this->keepalive_period_ < tVar7 - this->last_keepalive_) {
        std::__cxx11::string::_M_append
                  ((char *)&this->wbuffer_,(ulong)msg_keepalive_abi_cxx11_._M_dataplus._M_p);
        this->last_keepalive_ = tVar7;
      }
      if ((this->wbuffer_)._M_string_length != 0) {
        do {
          sVar8 = write(this->socket_,(this->wbuffer_)._M_dataplus._M_p,
                        (this->wbuffer_)._M_string_length);
          if (sVar8 != -1) goto LAB_00107d3d;
          puVar6 = (uint *)__errno_location();
        } while (*puVar6 == 4);
        if (*puVar6 != 0xb) {
          psVar10 = (system_error *)__cxa_allocate_exception(0x20);
          uVar1 = *puVar6;
          peVar11 = (error_category *)std::_V2::system_category();
          __ec_00._4_4_ = 0;
          __ec_00._M_value = uVar1;
          __ec_00._M_cat = peVar11;
          std::system_error::system_error(psVar10,__ec_00,"rapic: write failure");
          __cxa_throw(psVar10,&std::system_error::typeinfo,std::system_error::~system_error);
        }
LAB_00107d3d:
        std::__cxx11::string::erase((ulong)&this->wbuffer_,0);
      }
      bVar17 = false;
      do {
        if ((this->wcount_).super___atomic_base<unsigned_long>._M_i -
            (this->rcount_).super___atomic_base<unsigned_long>._M_i == this->capacity_) {
          return true;
        }
        uVar12 = (this->rcount_).super___atomic_base<unsigned_long>._M_i % this->capacity_;
        uVar13 = (this->wcount_).super___atomic_base<unsigned_long>._M_i % this->capacity_;
        uVar16 = this->capacity_;
        if (uVar13 < uVar12) {
          uVar16 = uVar12;
        }
        sVar9 = recv(this->socket_,
                     (this->buffer_)._M_t.
                     super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                     super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + uVar13,
                     uVar16 - uVar13,0);
        if ((long)sVar9 < 1) {
          if ((long)sVar9 < 0) {
            puVar6 = (uint *)__errno_location();
            bVar2 = true;
            if (*puVar6 == 4) goto LAB_00107e30;
            if (*puVar6 != 0xb) {
              this_00 = (runtime_error *)__cxa_allocate_exception(0x20);
              uVar1 = *puVar6;
              peVar11 = (error_category *)std::_V2::system_category();
              __ec_01._4_4_ = 0;
              __ec_01._M_value = uVar1;
              __ec_01._M_cat = peVar11;
              std::system_error::system_error((system_error *)this_00,__ec_01,"rapic: recv failure")
              ;
              pcVar14 = std::system_error::~system_error;
              puVar15 = &std::system_error::typeinfo;
LAB_00107f3e:
              __cxa_throw(this_00,puVar15,pcVar14);
            }
            if (this->inactivity_timeout_ < tVar7 - this->last_activity_) {
              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(this_00,"rapic: inactivity timeout");
              pcVar14 = std::runtime_error::~runtime_error;
              puVar15 = &std::runtime_error::typeinfo;
              goto LAB_00107f3e;
            }
          }
          else {
            if (this->socket_ != -1) {
              close(this->socket_);
            }
            this->socket_ = -1;
            this->state_ = disconnected;
            this->last_keepalive_ = 0;
            (this->wbuffer_)._M_string_length = 0;
            *(this->wbuffer_)._M_dataplus._M_p = '\0';
          }
          bVar2 = false;
          bVar17 = false;
        }
        else {
          this->last_activity_ = tVar7;
          LOCK();
          (this->wcount_).super___atomic_base<unsigned_long>._M_i =
               (this->wcount_).super___atomic_base<unsigned_long>._M_i + sVar9;
          UNLOCK();
          bVar17 = sVar9 == uVar16 - uVar13;
          bVar2 = false;
        }
LAB_00107e30:
        if (!bVar2) {
          return bVar17;
        }
      } while( true );
    }
    iVar5 = this->socket_;
    local_b8.fds_bits[0xe] = 0;
    local_b8.fds_bits[0xf] = 0;
    local_b8.fds_bits[0xc] = 0;
    local_b8.fds_bits[0xd] = 0;
    local_b8.fds_bits[10] = 0;
    local_b8.fds_bits[0xb] = 0;
    local_b8.fds_bits[8] = 0;
    local_b8.fds_bits[9] = 0;
    local_b8.fds_bits[6] = 0;
    local_b8.fds_bits[7] = 0;
    local_b8.fds_bits[4] = 0;
    local_b8.fds_bits[5] = 0;
    local_b8.fds_bits[2] = 0;
    local_b8.fds_bits[3] = 0;
    local_b8.fds_bits[0] = 0;
    local_b8.fds_bits[1] = 0;
    iVar4 = iVar5 + 0x3f;
    if (-1 < iVar5) {
      iVar4 = iVar5;
    }
    local_b8.fds_bits[iVar4 >> 6] =
         local_b8.fds_bits[iVar4 >> 6] | 1L << ((byte)(iVar5 % 0x40) & 0x3f);
    local_c8.tv_sec = 0;
    local_c8.tv_usec = 0;
    iVar4 = select(iVar5 + 1,(fd_set *)0x0,&local_b8,(fd_set *)0x0,&local_c8);
    if (iVar4 == -1) {
      puVar6 = (uint *)__errno_location();
      do {
        if (*puVar6 != 4) {
          psVar10 = (system_error *)__cxa_allocate_exception(0x20);
          uVar1 = *puVar6;
          peVar11 = (error_category *)std::_V2::system_category();
          __ec._4_4_ = 0;
          __ec._M_value = uVar1;
          __ec._M_cat = peVar11;
          std::system_error::system_error(psVar10,__ec,"rapic: select failure");
          __cxa_throw(psVar10,&std::system_error::typeinfo,std::system_error::~system_error);
        }
        local_c8.tv_sec = 0;
        local_c8.tv_usec = 0;
        iVar4 = select(iVar5 + 1,(fd_set *)0x0,&local_b8,(fd_set *)0x0,&local_c8);
      } while (iVar4 == -1);
    }
    if (iVar4 == 1) {
      local_b8.fds_bits[0] = local_b8.fds_bits[0] & 0xffffffff00000000;
      local_c8.tv_sec = CONCAT44(local_c8.tv_sec._4_4_,4);
      iVar5 = getsockopt(this->socket_,1,4,&local_b8,(socklen_t *)&local_c8);
      if (iVar5 < 0) {
        psVar10 = (system_error *)__cxa_allocate_exception(0x20);
        puVar6 = (uint *)__errno_location();
        uVar1 = *puVar6;
        peVar11 = (error_category *)std::_V2::system_category();
        __ec_02._4_4_ = 0;
        __ec_02._M_value = uVar1;
        __ec_02._M_cat = peVar11;
        std::system_error::system_error(psVar10,__ec_02,"rapic: getsockopt failure");
LAB_00107f9f:
        __cxa_throw(psVar10,&std::system_error::typeinfo,std::system_error::~system_error);
      }
      if ((int)local_b8.fds_bits[0] != 0x73) {
        if ((int)local_b8.fds_bits[0] < 0) {
          psVar10 = (system_error *)__cxa_allocate_exception(0x20);
          _Var3 = local_b8.fds_bits[0];
          peVar11 = (error_category *)std::_V2::system_category();
          __ec_03._0_8_ = _Var3 & 0xffffffff;
          __ec_03._M_cat = peVar11;
          std::system_error::system_error
                    (psVar10,__ec_03,"rapic: failed to establish connection (async)");
          goto LAB_00107f9f;
        }
        this->state_ = established;
        if ((int)local_b8.fds_bits[0] != 0x73) goto LAB_00107cc4;
      }
    }
  }
  return false;
}

Assistant:

auto client::process_traffic() -> bool
try
{
  // sanity check
  if (state_ == rapic::connection_state::disconnected)
    return false;

  // need to check our connection attempt progress
  if (state_ == rapic::connection_state::in_progress)
  {
    /* SO_ERROR is only set once the socket is writeable, so manually check via select that it is.
     * without this check clients can call process_traffic() before the socket is writeable and cause
     * the connection to look established before it really is. */
    if (!is_socket_writeable(socket_))
      return false;

    // get the socket error status
    int res = 0; socklen_t len = sizeof(res);
    if (getsockopt(socket_, SOL_SOCKET, SO_ERROR, &res, &len) < 0)
      throw std::system_error{errno, std::system_category(), "rapic: getsockopt failure"};

    // not connected yet?
    if (res == EINPROGRESS)
      return false;

    // okay, connection attempt is complete.  did it succeed?
    if (res < 0)
      throw std::system_error{res, std::system_category(), "rapic: failed to establish connection (async)"};

    state_ = rapic::connection_state::established;
  }

  // get current time
  auto now = time(NULL);

  // do we need to send a keepalive? (ie: RDRSTAT)
  if (now - last_keepalive_ > keepalive_period_)
  {
    wbuffer_.append(msg_keepalive);
    last_keepalive_ = now;
  }

  // write everything we can
  if (!wbuffer_.empty())
  {
    // write as much as we can
    ssize_t ret;
    while ((ret = write(socket_, wbuffer_.c_str(), wbuffer_.size())) == -1)
    {
      if (errno == EAGAIN || errno == EWOULDBLOCK)
      {
        ret = 0;
        break;
      }
      else if (errno != EINTR)
        throw std::system_error{errno, std::system_category(), "rapic: write failure"};
    }

    // remove the written data from the buffer
    wbuffer_.erase(0, ret);
  }

  // read everything we can
  while (true)
  {
    // if our buffer is full return and allow client to do some reading
    if (wcount_ - rcount_ == capacity_)
      return true;

    // determine current read and write positions
    auto rpos = rcount_ % capacity_;
    auto wpos = wcount_ % capacity_;

    // see how much _contiguous_ space is left in our buffer (may be less than total available write space)
    auto space = wpos < rpos ? rpos - wpos : capacity_ - wpos;

    // read some data off the wire
    auto bytes = recv(socket_, &buffer_[wpos], space, 0);
    if (bytes > 0)
    {
      // reset our inactivity timeout
      last_activity_ = now;

      // advance our write position
      wcount_ += bytes;

      // if we read as much as we asked for there may be more still waiting so return true
      return static_cast<size_t>(bytes) == space;
    }
    else if (bytes < 0)
    {
      // if we've run out of data to read stop trying
      if (errno == EAGAIN || errno == EWOULDBLOCK)
      {
        // check our inactivity timeout
        if (now - last_activity_ > inactivity_timeout_)
          throw std::runtime_error{"rapic: inactivity timeout"};

        return false;
      }

      // if we were interrupted by a signal handler just try again
      if (errno == EINTR)
        continue;

      // a real receive error - kill the connection
      throw std::system_error{errno, std::system_category(), "rapic: recv failure"};
    }
    else /* if (bytes == 0) */
    {
      // connection has been closed normally by the remote side
      disconnect();
      return false;
    }
  }
}
catch (...)
{
  disconnect();
  throw;
}